

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.hpp
# Opt level: O1

void __thiscall
viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr<double>
          (rt_expr<viennamath::rt_expression_interface<double>_> *this,
          rt_constant<double,_viennamath::rt_expression_interface<double>_> *other)

{
  rt_expression_interface<double> *prVar1;
  int iVar2;
  undefined4 extraout_var;
  
  (this->rt_expr_)._M_ptr = (rt_expression_interface<double> *)0x0;
  iVar2 = (*(other->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])(other);
  prVar1 = (this->rt_expr_)._M_ptr;
  if (prVar1 != (rt_expression_interface<double> *)CONCAT44(extraout_var,iVar2)) {
    if (prVar1 != (rt_expression_interface<double> *)0x0) {
      (*prVar1->_vptr_rt_expression_interface[1])();
    }
    (this->rt_expr_)._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var,iVar2);
  }
  return;
}

Assistant:

rt_expr(rt_constant<T, InterfaceType> const & other)
      {
        rt_expr_ = std::auto_ptr<InterfaceType>(other.clone());
      }